

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall
tcu::ScopedLogSection::ScopedLogSection
          (ScopedLogSection *this,TestLog *log,string *name,string *description)

{
  TestLog *this_00;
  LogSection local_68;
  string *local_28;
  string *description_local;
  string *name_local;
  TestLog *log_local;
  ScopedLogSection *this_local;
  
  this->m_log = log;
  this_00 = this->m_log;
  local_28 = description;
  description_local = name;
  name_local = (string *)log;
  log_local = (TestLog *)this;
  LogSection::LogSection(&local_68,name,description);
  TestLog::operator<<(this_00,&local_68);
  LogSection::~LogSection(&local_68);
  return;
}

Assistant:

ScopedLogSection (TestLog& log, const std::string& name, const std::string& description)
		: m_log(log)
	{
		m_log << TestLog::Section(name, description);
	}